

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O0

String * anon_unknown.dwarf_32e87c::combineStrings
                   (vector<sf::String,_std::allocator<sf::String>_> *stringArray)

{
  size_type sVar1;
  String *this;
  vector<sf::String,_std::allocator<sf::String>_> *in_RSI;
  String *in_RDI;
  size_t i;
  String *str;
  String *in_stack_ffffffffffffff58;
  String *in_stack_ffffffffffffff88;
  locale local_68 [8];
  locale *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  String *in_stack_ffffffffffffffb0;
  ulong local_20;
  
  sf::String::String((String *)0x25ac61);
  for (local_20 = 0; sVar1 = std::vector<sf::String,_std::allocator<sf::String>_>::size(in_RSI),
      local_20 < sVar1; local_20 = local_20 + 1) {
    this = (String *)0x39a514;
    if (local_20 == 0) {
      this = (String *)0x39a515;
    }
    std::locale::locale(local_68);
    sf::String::String(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
                      );
    std::vector<sf::String,_std::allocator<sf::String>_>::operator[](in_RSI,local_20);
    sf::operator+(in_stack_ffffffffffffff88,in_RDI);
    sf::String::operator+=(this,in_stack_ffffffffffffff58);
    sf::String::~String((String *)0x25ad23);
    sf::String::~String((String *)0x25ad2d);
    std::locale::~locale(local_68);
  }
  return in_RDI;
}

Assistant:

sf::String combineStrings(const std::vector<sf::String>& stringArray) {
    sf::String str;
    for (size_t i = 0; i < stringArray.size(); ++i) {
        str += (i == 0 ? "" : "\n") + stringArray[i];
    }
    return str;
}